

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::LevelTest_TestTargetLevelRecode_Test::~LevelTest_TestTargetLevelRecode_Test
          (LevelTest_TestTargetLevelRecode_Test *this)

{
  anon_unknown.dwarf_128b966::LevelTest_TestTargetLevelRecode_Test::
  ~LevelTest_TestTargetLevelRecode_Test((LevelTest_TestTargetLevelRecode_Test *)(this + -0x18));
  return;
}

Assistant:

TEST_P(LevelTest, TestTargetLevelRecode) {
  if (cpu_used_ == 4 && encoding_mode_ == ::libaom_test::kTwoPassGood) {
    libaom_test::I420VideoSource video("rand_noise_w1280h720.yuv", 1280, 720,
                                       25, 1, 0, 10);
    const int target_level = 0005;
    target_level_ = target_level;
    cfg_.rc_target_bitrate = 5000;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  }
}